

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_loop.c
# Opt level: O0

void enc_loop_avx2_inner(uint8_t **s,uint8_t **o)

{
  undefined8 *puVar1;
  __m256i input;
  longlong unaff_RBP;
  long *in_RSI;
  long *in_RDI;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __m256i src;
  __m256i in_stack_ffffffffffffffd8;
  
  puVar1 = (undefined8 *)*in_RDI;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  input._8_24_ = src._0_24_;
  input[0] = unaff_RBP;
  enc_reshuffle(input);
  enc_translate(in_stack_ffffffffffffffd8);
  puVar1 = (undefined8 *)*in_RSI;
  *puVar1 = uVar2;
  puVar1[1] = uVar3;
  puVar1[2] = uVar4;
  puVar1[3] = uVar5;
  *in_RDI = *in_RDI + 0x18;
  *in_RSI = *in_RSI + 0x20;
  return;
}

Assistant:

static inline void
enc_loop_avx2_inner (const uint8_t **s, uint8_t **o)
{
	// Load input:
	__m256i src = _mm256_loadu_si256((__m256i *) *s);

	// Reshuffle, translate, store:
	src = enc_reshuffle(src);
	src = enc_translate(src);
	_mm256_storeu_si256((__m256i *) *o, src);

	*s += 24;
	*o += 32;
}